

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall DenseIntMap<int>::DenseIntMap(DenseIntMap<int> *this)

{
  allocator_type *in_RDI;
  key_type *in_stack_ffffffffffffffc8;
  libc_allocator_with_realloc<std::pair<const_int,_int>_> *this_00;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  size_type in_stack_ffffffffffffffe8;
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffff0;
  
  this_00 = (libc_allocator_with_realloc<std::pair<const_int,_int>_> *)&stack0xfffffffffffffff5;
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::libc_allocator_with_realloc
            (this_00);
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::dense_hash_map(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
                   (hasher *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   (key_equal *)this_00,in_RDI);
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::~libc_allocator_with_realloc
            ((libc_allocator_with_realloc<std::pair<const_int,_int>_> *)&stack0xfffffffffffffff5);
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::set_empty_key((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                   *)in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

DenseIntMap() { this->set_empty_key(0); }